

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_load_image_from_format_to_buffer
          (rf_image *__return_storage_ptr__,void *src,rf_int src_size,int src_width,int src_height,
          rf_uncompressed_pixel_format src_format,void *dst,rf_int dst_size,
          rf_uncompressed_pixel_format dst_format)

{
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (dst_format - RF_UNCOMPRESSED_GRAYSCALE < 10) {
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = src_width;
    __return_storage_ptr__->height = src_height;
    __return_storage_ptr__->format = dst_format;
    rf_format_pixels(src,src_size,src_format,dst,dst_size,dst_format);
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_load_image_from_format_to_buffer(const void* src, rf_int src_size, int src_width, int src_height, rf_uncompressed_pixel_format src_format, void* dst, rf_int dst_size, rf_uncompressed_pixel_format dst_format)
{
    rf_image result = {0};

    if (rf_is_uncompressed_format(dst_format))
    {
        result = (rf_image) {
            .data   = dst,
            .width  = src_width,
            .height = src_height,
            .format = dst_format,
        };

        bool success = rf_format_pixels(src, src_size, src_format, dst, dst_size, dst_format);
        RF_ASSERT(success);
    }

    return result;
}